

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_MutObjective_Test::TestBody(ProblemTest_MutObjective_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  iterator this_00;
  pointer pTVar4;
  char *pcVar5;
  MutObjective MVar6;
  Objective OVar7;
  Objective cobj;
  Problem *cp;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  const_iterator it;
  AssertionResult gtest_ar_1;
  int num_terms;
  double coefs [1];
  int indices [1];
  AssertionResult gtest_ar;
  NumericConstant expr;
  MutObjective obj;
  Problem p;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  ExprBase in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa1c;
  ExprBase in_stack_fffffffffffffa20;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffa34;
  undefined8 in_stack_fffffffffffffa38;
  Type type;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  undefined4 in_stack_fffffffffffffa88;
  int in_stack_fffffffffffffa8c;
  AssertHelper *in_stack_fffffffffffffa90;
  AssertionResult local_4b8 [2];
  Term *local_498;
  AssertionResult local_490 [2];
  double local_470;
  AssertionResult local_468 [2];
  int local_444;
  AssertionResult local_440;
  int local_42c;
  Term *local_428;
  small_vector_iterator<const_mp::LinearExpr::Term_*,_long> local_420 [3];
  int local_404;
  AssertionResult local_400;
  int local_3ec;
  undefined8 local_3e8;
  undefined4 local_3dc;
  ExprBase local_3c8;
  AssertionResult local_3c0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_3b0;
  Impl *local_3a0;
  BasicProblem<mp::BasicProblemParams<int>_> *local_398;
  int local_390;
  BasicProblem<mp::BasicProblemParams<int>_> *local_388;
  int local_380;
  LinearExpr *local_378;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  local_378 = (LinearExpr *)
              mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
                        (in_stack_fffffffffffffa28,
                         (Type)((ulong)in_stack_fffffffffffffa20.impl_ >> 0x20),
                         (int)in_stack_fffffffffffffa20.impl_);
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)in_stack_fffffffffffffa20.impl_,
                     in_stack_fffffffffffffa1c);
  local_398 = MVar6.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_390 = MVar6.
              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_388 = local_398;
  local_380 = local_390;
  local_3b0.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                  (double)in_stack_fffffffffffffa10.impl_);
  local_3a0 = (Impl *)local_3b0.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             (NumericConstant)in_stack_fffffffffffffa20.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffa10.impl_ >> 0x20));
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::set_nonlinear_expr
            ((MutObjective *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (NumericExpr)in_stack_fffffffffffffa10.impl_);
  local_3c8.impl_ =
       (Impl *)mp::BasicProblem<mp::BasicProblemParams<int>_>::
               BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               ::nonlinear_expr((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
  testing::internal::EqHelper<false>::
  Compare<mp::NumericConstant,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20.impl_,
             (NumericConstant *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffa10.impl_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::AssertionResult::failure_message((AssertionResult *)0x11db84);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
               (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
               (char *)in_stack_fffffffffffffa20.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa90,
               (Message *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa10.impl_);
    testing::Message::~Message((Message *)0x11dbe7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11dc3f);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::linear_expr
            ((MutObjective *)0x11dc4c);
  mp::LinearExpr::AddTerm
            ((LinearExpr *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
             (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),(double)in_stack_fffffffffffffa20.impl_
            );
  local_3dc = 0xb;
  local_3e8 = 0x400199999999999a;
  local_3ec = 1;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::linear_expr
            ((MutObjective *)0x11dc98);
  local_404 = mp::LinearExpr::num_terms((LinearExpr *)0x11dca0);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20.impl_,
             (int *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             (int *)in_stack_fffffffffffffa10.impl_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
    testing::AssertionResult::failure_message((AssertionResult *)0x11dd53);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
               (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
               (char *)in_stack_fffffffffffffa20.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa90,
               (Message *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa10.impl_);
    testing::Message::~Message((Message *)0x11ddb6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11de0e);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::linear_expr
            ((MutObjective *)0x11de1b);
  this_00 = mp::LinearExpr::begin
                      ((LinearExpr *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  local_428 = this_00.m_ptr;
  gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::
  small_vector_iterator<mp::LinearExpr::Term_*,_long,_nullptr>
            ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
             in_stack_fffffffffffffa10.impl_,
             (small_vector_iterator<mp::LinearExpr::Term_*,_long> *)
             CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  local_42c = 0;
  while (type = (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20), local_42c < local_3ec) {
    pTVar4 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x11de93);
    in_stack_fffffffffffffa8c = mp::LinearExpr::Term::var_index(pTVar4);
    local_444 = in_stack_fffffffffffffa8c;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20.impl_,
               (int *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
               (int *)in_stack_fffffffffffffa10.impl_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_440);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
      testing::AssertionResult::failure_message((AssertionResult *)0x11df45);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                 (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                 (char *)in_stack_fffffffffffffa20.impl_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00.m_ptr,
                 (Message *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffa10.impl_);
      testing::Message::~Message((Message *)0x11dfa2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11dffa);
    pTVar4 = gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator->
                       ((small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)0x11e01c);
    local_470 = mp::LinearExpr::Term::coef(pTVar4);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20.impl_,
               (double *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
               (double *)in_stack_fffffffffffffa10.impl_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_468);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
      testing::AssertionResult::failure_message((AssertionResult *)0x11e0ce);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                 (Type)((ulong)in_stack_fffffffffffffa38 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                 (char *)in_stack_fffffffffffffa20.impl_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00.m_ptr,
                 (Message *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffa10.impl_);
      testing::Message::~Message((Message *)0x11e12b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11e180);
    local_42c = local_42c + 1;
    gch::small_vector_iterator<const_mp::LinearExpr::Term_*,_long>::operator++(local_420);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::linear_expr
            ((MutObjective *)0x11e1c2);
  local_498 = (Term *)mp::LinearExpr::end((LinearExpr *)
                                          CONCAT44(in_stack_fffffffffffffa0c,
                                                   in_stack_fffffffffffffa08));
  testing::internal::EqHelper<false>::
  Compare<gch::small_vector_iterator<mp::LinearExpr::Term*,long>,gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20.impl_,
             (small_vector_iterator<mp::LinearExpr::Term_*,_long> *)
             CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)
             in_stack_fffffffffffffa10.impl_);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_490);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffa40));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x11e262);
    type = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffa40),type,
               (char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
               (char *)in_stack_fffffffffffffa20.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00.m_ptr,
               (Message *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa10.impl_);
    testing::Message::~Message((Message *)0x11e2bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11e317);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::linear_expr
            ((MutObjective *)0x11e32f);
  iVar3 = mp::LinearExpr::num_terms((LinearExpr *)0x11e337);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20.impl_,
             (int *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             (int *)in_stack_fffffffffffffa10.impl_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b8);
  uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa30);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffffa40));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x11e3de);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffa40),type,
               (char *)CONCAT44(iVar3,uVar8),(int)((ulong)pcVar5 >> 0x20),
               (char *)in_stack_fffffffffffffa20.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00.m_ptr,
               (Message *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa10.impl_);
    testing::Message::~Message((Message *)0x11e43b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11e493);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::obj
            ((BasicProblem<mp::BasicProblemParams<int>_> *)in_stack_fffffffffffffa20.impl_,
             in_stack_fffffffffffffa1c);
  OVar7 = mp::BasicProblem::MutObjective::operator_cast_to_BasicObjective((MutObjective *)0x11e500);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            (OVar7.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
             problem_);
  return;
}

Assistant:

TEST(ProblemTest, MutObjective) {
  Problem p;
  p.AddObj(mp::obj::MIN);
  Problem::MutObjective obj = p.obj(0);
  auto expr = p.MakeNumericConstant(42);
  obj.set_nonlinear_expr(expr);
  EXPECT_EQ(expr, obj.nonlinear_expr());
  obj.linear_expr().AddTerm(11, 2.2);
  const int indices[] = {11};
  const double coefs[] = {2.2};
  EXPECT_LINEAR_EXPR(obj.linear_expr(), indices, coefs);
  EXPECT_EQ(1, obj.linear_expr().num_terms());
  const Problem &cp = p;
  Problem::Objective cobj = cp.obj(0);
  cobj = obj;
}